

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O0

int __thiscall
CDesign::GetNetInBBox(CDesign *this,vector<CNet_*,_std::allocator<CNet_*>_> *pNetList,CBBox *pBBox)

{
  int iVar1;
  size_type sVar2;
  bool bVar3;
  CNet *local_30;
  CNet *pNet;
  int i;
  int iNumNet;
  CBBox *pBBox_local;
  vector<CNet_*,_std::allocator<CNet_*>_> *pNetList_local;
  CDesign *this_local;
  
  bVar3 = true;
  _i = pBBox;
  pBBox_local = (CBBox *)pNetList;
  pNetList_local = (vector<CNet_*,_std::allocator<CNet_*>_> *)this;
  if (pNetList != (vector<CNet_*,_std::allocator<CNet_*>_> *)0x0) {
    sVar2 = std::vector<CNet_*,_std::allocator<CNet_*>_>::size(pNetList);
    bVar3 = sVar2 == 0;
  }
  if (bVar3) {
    pNet._4_4_ = 0;
    pNet._0_4_ = 0;
    do {
      if (this->m_iNumNet <= (int)pNet) {
        return pNet._4_4_;
      }
      local_30 = GetNet(this,(int)pNet);
      if (local_30 != (CNet *)0x0) {
        if (local_30 == (CNet *)0x0) {
          __assert_fail("pNet",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                        ,0x5b0,"int CDesign::GetNetInBBox(vector<CNet *> *, CBBox *)");
        }
        iVar1 = CNet::IsRouted(local_30);
        if (iVar1 == 0) {
          CNet::UpdateBBox(local_30);
          iVar1 = CBBox::IsInside(_i,&local_30->m_BBox);
          if ((iVar1 != 0) && (pNet._4_4_ = pNet._4_4_ + 1, pBBox_local != (CBBox *)0x0)) {
            std::vector<CNet_*,_std::allocator<CNet_*>_>::push_back
                      ((vector<CNet_*,_std::allocator<CNet_*>_> *)pBBox_local,&local_30);
          }
        }
      }
      pNet._0_4_ = (int)pNet + 1;
    } while( true );
  }
  __assert_fail("pNetList==NULL||pNetList->size()==0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                ,0x5a8,"int CDesign::GetNetInBBox(vector<CNet *> *, CBBox *)");
}

Assistant:

int CDesign::GetNetInBBox(vector<CNet*>* pNetList, CBBox* pBBox/*, int iMode, int iValue*/)
{
	//collect the all nets within the give box, satisfying the given condition (property/state)
	assert(pNetList==NULL||pNetList->size()==0);
	
	int	iNumNet	=	0;
	for (int i=0;i<m_iNumNet;++i)
	{
		CNet*	pNet	=	GetNet(i);
		
		if(!pNet)	continue;
		assert(pNet);

		//int		iContinue	=	TRUE;

		//switch(iMode){
		//case GET_MODE_STATE:
		//	if(pNet->GetState()&iValue)	iContinue	=	FALSE;
		//	break;
		//case GET_MODE_PROP:
		//	if(pNet->GetProp()&iValue)	iContinue	=	FALSE;
		//    break;
		//default:
		//    break;
		//}
		
		if(pNet->IsRouted())	continue;

		pNet->UpdateBBox();
		if(pBBox->IsInside(&pNet->m_BBox))
		{
			++iNumNet;
			if(pNetList)	pNetList->push_back(pNet);
		}		
	}
	
	return	iNumNet;
}